

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O1

bool __thiscall mnf::CartesianProduct::isSameTopology(CartesianProduct *this,Manifold *other)

{
  element_type *peVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar7;
  bool bVar8;
  
  bVar8 = false;
  lVar6 = __dynamic_cast(other,&Manifold::typeinfo,&typeinfo,0);
  if (lVar6 != 0) {
    iVar4 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
    iVar5 = (*other->_vptr_Manifold[7])(other);
    if (CONCAT44(extraout_var,iVar4) == CONCAT44(extraout_var_00,iVar5)) {
      iVar4 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
      bVar8 = CONCAT44(extraout_var_01,iVar4) == 0;
      if (!bVar8) {
        peVar1 = (((this->subManifolds_).
                   super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar4 = (*other->_vptr_Manifold[8])(other,0);
        cVar3 = (**(code **)((long)peVar1->_vptr_Manifold + 0x50))(peVar1,iVar4);
        if (cVar3 != '\0') {
          lVar6 = 0x10;
          uVar7 = 1;
          do {
            iVar4 = (*(this->super_Manifold)._vptr_Manifold[7])(this);
            bVar8 = CONCAT44(extraout_var_02,iVar4) <= uVar7;
            if (bVar8) {
              return bVar8;
            }
            plVar2 = *(long **)((long)&(((this->subManifolds_).
                                         super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar6);
            iVar4 = (*other->_vptr_Manifold[8])(other,uVar7);
            cVar3 = (**(code **)(*plVar2 + 0x50))(plVar2,iVar4);
            lVar6 = lVar6 + 0x10;
            uVar7 = uVar7 + 1;
          } while (cVar3 != '\0');
        }
      }
    }
    else {
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool CartesianProduct::isSameTopology(const Manifold& other) const
{
  if (dynamic_cast<const CartesianProduct*>(&other) &&
      numberOfSubManifolds() == other.numberOfSubManifolds())
  {
    for (size_t i = 0; i < numberOfSubManifolds(); ++i)
    {
      if (!subManifolds_[i]->isSameTopology(other(i))) return false;
    }
    return true;
  }
  else
    return false;
}